

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

RepeatedField<long> * __thiscall
google::protobuf::RepeatedField<long>::operator=
          (RepeatedField<long> *this,RepeatedField<long> *other)

{
  Arena *this_00;
  Arena *other_00;
  RepeatedField<long> *in_RSI;
  RepeatedField<long> *in_RDI;
  RepeatedField<long> *in_stack_00000098;
  RepeatedField<long> *in_stack_000000a0;
  RepeatedField<long> *in_stack_ffffffffffffffe0;
  
  if (in_RDI != in_RSI) {
    this_00 = GetArenaNoVirtual(in_stack_ffffffffffffffe0);
    other_00 = GetArenaNoVirtual((RepeatedField<long> *)this_00);
    if (this_00 == other_00) {
      InternalSwap(in_stack_000000a0,in_stack_00000098);
    }
    else {
      CopyFrom((RepeatedField<long> *)this_00,(RepeatedField<long> *)other_00);
    }
  }
  return in_RDI;
}

Assistant:

inline RepeatedField<Element>& RepeatedField<Element>::operator=(
    RepeatedField&& other) noexcept {
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // the two fields are on different arenas.
  if (this != &other) {
    if (this->GetArenaNoVirtual() != other.GetArenaNoVirtual()) {
      CopyFrom(other);
    } else {
      InternalSwap(&other);
    }
  }
  return *this;
}